

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

time_t __thiscall cmTimestamp::CreateUtcTimeTFromTm(cmTimestamp *this,tm *tm)

{
  time_t tVar1;
  time_t result;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  byte local_39;
  undefined1 local_38 [7];
  bool tz_was_set;
  string tz_old;
  tm *tm_local;
  cmTimestamp *this_local;
  
  tz_old.field_2._8_8_ = tm;
  std::__cxx11::string::string((string *)local_38);
  local_39 = cmsys::SystemTools::GetEnv("TZ",(string *)local_38);
  std::operator+(&local_70,"TZ=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"TZ=UTC",(allocator<char> *)((long)&result + 7));
  cmsys::SystemTools::PutEnv(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
  tzset();
  tVar1 = mktime((tm *)tz_old.field_2._8_8_);
  if ((local_39 & 1) == 0) {
    cmSystemTools::UnsetEnv("TZ");
  }
  else {
    cmsys::SystemTools::PutEnv((string *)local_38);
  }
  tzset();
  std::__cxx11::string::~string((string *)local_38);
  return tVar1;
}

Assistant:

time_t cmTimestamp::CreateUtcTimeTFromTm(struct tm& tm) const
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
  return _mkgmtime(&tm);
#else
  // From Linux timegm() manpage.

  std::string tz_old;
  bool const tz_was_set = cmSystemTools::GetEnv("TZ", tz_old);
  tz_old = "TZ=" + tz_old;

  // The standard says that "TZ=" or "TZ=[UNRECOGNIZED_TZ]" means UTC.
  // It seems that "TZ=" does NOT work, at least under Windows
  // with neither MSVC nor MinGW, so let's use explicit "TZ=UTC"

  cmSystemTools::PutEnv("TZ=UTC");

  tzset();

  time_t result = mktime(&tm);

#  ifndef CMAKE_BOOTSTRAP
  if (tz_was_set) {
    cmSystemTools::PutEnv(tz_old);
  } else {
    cmSystemTools::UnsetEnv("TZ");
  }
#  else
  // No UnsetEnv during bootstrap.  This is good enough for CMake itself.
  cmSystemTools::PutEnv(tz_old);
  static_cast<void>(tz_was_set);
#  endif

  tzset();

  return result;
#endif
}